

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::StringSubstrMethod::eval
          (StringSubstrMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  int iVar1;
  bool bVar2;
  string *this_00;
  SVInt *__len;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  _Optional_payload_base<int> __pos;
  EvalContext *pEVar4;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  ConstantValue *in_RDI;
  int32_t count;
  int32_t right;
  int32_t left;
  string *str;
  ConstantValue rightCv;
  ConstantValue leftCv;
  ConstantValue strCv;
  string *in_stack_fffffffffffffe78;
  EvalContext *in_stack_fffffffffffffe80;
  Expression *in_stack_fffffffffffffe88;
  SVInt *in_stack_fffffffffffffe98;
  string *__str;
  
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,1);
  Expression::eval(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,2);
  Expression::eval(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  bVar2 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x9aa2da);
  if (((bVar2) &&
      (bVar2 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x9aa2f7), bVar2)) &&
     (bVar2 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x9aa314), bVar2)) {
    this_00 = slang::ConstantValue::str_abi_cxx11_((ConstantValue *)0x9aa39c);
    __str = this_00;
    __len = slang::ConstantValue::integer((ConstantValue *)0x9aa3bd);
    SVInt::as<int>(in_stack_fffffffffffffe98);
    piVar3 = std::optional<int>::value((optional<int> *)in_stack_fffffffffffffe80);
    iVar1 = *piVar3;
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              slang::ConstantValue::integer((ConstantValue *)0x9aa411);
    __pos = (_Optional_payload_base<int>)SVInt::as<int>((SVInt *)this_01);
    piVar3 = std::optional<int>::value((optional<int> *)in_stack_fffffffffffffe80);
    if ((-1 < iVar1) && (iVar1 <= *piVar3)) {
      in_stack_fffffffffffffe80 = (EvalContext *)(long)*piVar3;
      pEVar4 = (EvalContext *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               length(this_00);
      if (in_stack_fffffffffffffe80 < pEVar4) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (this_01,(size_type)__pos,(size_type)piVar3);
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe80);
        goto LAB_009aa58f;
      }
    }
    s_abi_cxx11_((char *)__str,(size_t)__len);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe80);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  }
LAB_009aa58f:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x9aa59c);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x9aa5a9);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x9aa5b6);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto strCv = args[0]->eval(context);
        auto leftCv = args[1]->eval(context);
        auto rightCv = args[2]->eval(context);
        if (!strCv || !leftCv || !rightCv)
            return nullptr;

        const std::string& str = strCv.str();
        int32_t left = leftCv.integer().as<int32_t>().value();
        int32_t right = rightCv.integer().as<int32_t>().value();
        if (left < 0 || right < left || size_t(right) >= str.length())
            return ""s;

        int32_t count = right - left + 1;
        return str.substr(size_t(left), size_t(count));
    }